

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall Time::Time(Time *this,int64 time,bool utc)

{
  tm *local_78;
  tm *tm;
  tm tmBuf;
  time_t now;
  bool utc_local;
  int64 time_local;
  Time *this_local;
  
  this->utc = utc;
  tmBuf.tm_zone = (char *)(time / 1000);
  if (utc) {
    local_78 = gmtime_r((time_t *)&tmBuf.tm_zone,(tm *)&tm);
  }
  else {
    local_78 = localtime_r((time_t *)&tmBuf.tm_zone,(tm *)&tm);
  }
  this->sec = local_78->tm_sec;
  this->min = local_78->tm_min;
  this->hour = local_78->tm_hour;
  this->day = local_78->tm_mday;
  this->month = local_78->tm_mon + 1;
  this->year = local_78->tm_year + 0x76c;
  this->wday = local_78->tm_wday;
  this->yday = local_78->tm_yday;
  this->dst = local_78->tm_isdst != 0;
  return;
}

Assistant:

Time::Time(int64 time, bool utc) : utc(utc)
{
  time_t now = (time_t)(time / 1000LL);
#ifdef _WIN32
  tm* tm = utc ? ::gmtime(&now) : ::localtime(&now); // win32 gmtime and localtime are thread save
#else
  struct tm tmBuf;
  tm* tm = utc ? ::gmtime_r(&now, &tmBuf) : ::localtime_r(&now, &tmBuf);
#endif
  sec = tm->tm_sec;
  min = tm->tm_min;
  hour = tm->tm_hour;
  day = tm->tm_mday;
  month = tm->tm_mon + 1;
  year = tm->tm_year + 1900;
  wday = tm->tm_wday;
  yday = tm->tm_yday;
  dst = !!tm->tm_isdst;
}